

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
SimpleStringBuffer::addMemoryDump(SimpleStringBuffer *this,void *memory,size_t memorySize)

{
  ulong in_RDX;
  long in_RSI;
  SimpleStringBuffer *in_RDI;
  char toAdd;
  size_t leftoverBytes;
  size_t bytesInLine;
  size_t p;
  size_t currentPos;
  size_t maxLineBytes;
  uchar *byteMemory;
  char local_49;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  
  for (local_30 = 0; local_30 < in_RDX; local_30 = local_40 + local_30) {
    add(in_RDI,"    %04lx: ",local_30);
    local_40 = in_RDX - local_30;
    if (0x10 < local_40) {
      local_40 = 0x10;
    }
    for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
      add(in_RDI,"%02hx ",(ulong)*(byte *)(in_RSI + local_30 + local_38));
      if (local_38 == 7) {
        add(in_RDI," ");
      }
    }
    for (local_38 = 0; local_38 < 0x10 - local_40; local_38 = local_38 + 1) {
      add(in_RDI,"   ");
    }
    if (8 < 0x10 - local_40) {
      add(in_RDI," ");
    }
    add(in_RDI,"|");
    for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
      local_49 = *(char *)(in_RSI + local_30 + local_38);
      if ((local_49 < ' ') || ('~' < local_49)) {
        local_49 = '.';
      }
      add(in_RDI,"%c",(ulong)(uint)(int)local_49);
    }
    add(in_RDI,"|\n");
  }
  return;
}

Assistant:

void SimpleStringBuffer::addMemoryDump(const void* memory, size_t memorySize)
{
    const unsigned char* byteMemory = (const unsigned char*)memory;
    const size_t maxLineBytes = 16;
    size_t currentPos = 0;
    size_t p;

    while (currentPos < memorySize) {
        add("    %04lx: ", (unsigned long) currentPos);
        size_t bytesInLine = memorySize - currentPos;
        if (bytesInLine > maxLineBytes) {
            bytesInLine = maxLineBytes;
        }
        const size_t leftoverBytes = maxLineBytes - bytesInLine;

        for (p = 0; p < bytesInLine; p++) {
            add("%02hx ", (unsigned short) byteMemory[currentPos + p]);
            if (p == ((maxLineBytes / 2) - 1)) {
                add(" ");
            }
        }
        for (p = 0; p < leftoverBytes; p++) {
            add("   ");
        }
        if (leftoverBytes > (maxLineBytes/2)) {
            add(" ");
        }

        add("|");
        for (p = 0; p < bytesInLine; p++) {
            char toAdd = (char)byteMemory[currentPos + p];
            if (toAdd < ' ' || toAdd > '~') {
                toAdd = '.';
            }
            add("%c", (int)toAdd);
        }
        add("|\n");
        currentPos += bytesInLine;
    }
}